

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

void __thiscall QHostAddress::setAddress(QHostAddress *this,quint32 ip4Addr)

{
  undefined4 in_ESI;
  undefined8 in_RDI;
  quint32 a_;
  undefined4 in_stack_fffffffffffffff0;
  
  a_ = (quint32)((ulong)in_RDI >> 0x20);
  QExplicitlySharedDataPointer<QHostAddressPrivate>::detach
            ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
            ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x216c48);
  QHostAddressPrivate::setAddress
            ((QHostAddressPrivate *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),a_);
  return;
}

Assistant:

void QHostAddress::setAddress(quint32 ip4Addr)
{
    d.detach();
    d->setAddress(ip4Addr);
}